

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  string *psVar1;
  size_type local_28 [2];
  unsigned_long local_18;
  
  WriteTag(field_number,WIRETYPE_LENGTH_DELIMITED,output);
  local_28[0] = value->_M_string_length;
  local_18 = 0x7fffffff;
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     (local_28,&local_18,"value.size() <= kInt32MaxSize");
  if (psVar1 == (string *)0x0) {
    io::CodedOutputStream::WriteVarint32(output,(uint32_t)value->_M_string_length);
    io::CodedOutputStream::WriteString(output,value);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/wire_format_lite.cc"
             ,0x1ee,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}